

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_433838::SpotController::on_create
          (SpotController *this,Caliper *param_1,Channel *param_2)

{
  bool bVar1;
  ostream *poVar2;
  string local_258;
  Log local_228;
  Channel *local_20;
  Channel *param_2_local;
  Caliper *param_1_local;
  SpotController *this_local;
  
  local_20 = param_2;
  param_2_local = (Channel *)param_1;
  param_1_local = (Caliper *)this;
  bVar1 = cali::ConfigManager::error(&this->m_timeseries_mgr);
  if (bVar1) {
    cali::Log::Log(&local_228,0);
    poVar2 = cali::Log::stream(&local_228);
    poVar2 = std::operator<<(poVar2,"[spot controller]: Timeseries config error: ");
    cali::ConfigManager::error_msg_abi_cxx11_(&local_258,&this->m_timeseries_mgr);
    poVar2 = std::operator<<(poVar2,(string *)&local_258);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_258);
    cali::Log::~Log(&local_228);
  }
  cali::ConfigManager::start(&this->m_timeseries_mgr);
  return;
}

Assistant:

void on_create(Caliper*, Channel&) override
    {
        if (m_timeseries_mgr.error())
            Log(0).stream() << "[spot controller]: Timeseries config error: " << m_timeseries_mgr.error_msg()
                            << std::endl;

        m_timeseries_mgr.start();
    }